

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O3

void __thiscall p2t::Triangle::DebugPrint(Triangle *this)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<double>(this->points_[0]->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(this->points_[0]->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>(this->points_[1]->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(this->points_[1]->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>(this->points_[2]->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(this->points_[2]->y);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Triangle::DebugPrint()
{
  using namespace std;
  cout << points_[0]->x << "," << points_[0]->y << " ";
  cout << points_[1]->x << "," << points_[1]->y << " ";
  cout << points_[2]->x << "," << points_[2]->y << endl;
}